

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::CreateBCGeoEl
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,int side,int bc)

{
  TPZGeoMesh *pTVar1;
  int i;
  MElementType MVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  undefined4 extraout_var;
  int orientednode;
  ulong uVar8;
  ulong uVar9;
  int64_t index;
  TPZGeoElSide BCGelside;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<long,_4> nodeindices;
  TPZGeoElSide thisside;
  TPZManVector<int,_27> mapside;
  TPZGeoEl *gel;
  
  if ((uint)side < 3) {
    MVar2 = pztopology::TPZLine::Type(side);
    uVar3 = pztopology::TPZLine::NSideNodes(side);
    if (EQuadrilateral < MVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                 ,0x124);
    }
    lVar7 = *(long *)(&DAT_01302ab8 + (ulong)MVar2 * 8);
    LowAllSides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0;
    TPZManVector<int,_27>::TPZManVector(&mapside,lVar7,(int *)&LowAllSides);
    for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
      mapside.super_TPZVec<int>.fStore[lVar6] = (int)lVar6;
    }
    TPZStack<int,_10>::TPZStack(&LowAllSides);
    pztopology::TPZLine::LowerDimensionSides(side,&LowAllSides);
    TPZStack<int,_10>::Push(&LowAllSides,side);
    TPZManVector<long,_4>::TPZManVector(&nodeindices,(long)(int)uVar3);
    uVar8 = 0;
    uVar9 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar9 = uVar8;
    }
    for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      lVar7 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))(this,side,uVar8 & 0xffffffff);
      nodeindices.super_TPZVec<long>.fStore[uVar8] = lVar7;
    }
    MVar2 = pztopology::TPZLine::Type(side);
    pTVar1 = (this->super_TPZGeoEl).fMesh;
    iVar4 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (pTVar1,(ulong)MVar2,&nodeindices,(ulong)(uint)bc,&index,1);
    gel = (TPZGeoEl *)CONCAT44(extraout_var,iVar4);
    TPZGeoElSide::TPZGeoElSide(&BCGelside,gel);
    thisside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    thisside.fGeoEl = &this->super_TPZGeoEl;
    thisside.fSide = side;
    TPZGeoElSide::InsertConnectivity(&BCGelside,&thisside,&mapside.super_TPZVec<int>);
    (**(code **)(*(long *)gel + 0x78))(gel);
    TPZManVector<long,_4>::~TPZManVector(&nodeindices);
    TPZManVector<int,_10>::~TPZManVector(&LowAllSides.super_TPZManVector<int,_10>);
    TPZManVector<int,_27>::~TPZManVector(&mapside);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"\n (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
    poVar5 = std::operator<<(poVar5,")::CreateBCGeoEl unexpected side = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,side);
    std::operator<<(poVar5,"\n");
    gel = (TPZGeoEl *)0x0;
  }
  return gel;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}